

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O1

void SstFFSSetZFPParams(SstStream Stream,attr_list Attrs)

{
  void *pvVar1;
  FFSWriterMarshalBase *Info;
  
  pvVar1 = Stream->WriterMarshalData;
  if (pvVar1 != (void *)0x0) {
    if (*(long *)((long)pvVar1 + 0x70) != 0) {
      free_attr_list();
    }
    add_ref_attr_list(Attrs);
    *(attr_list *)((long)pvVar1 + 0x70) = Attrs;
  }
  return;
}

Assistant:

extern void SstFFSSetZFPParams(SstStream Stream, attr_list Attrs)
{
    if (Stream->WriterMarshalData)
    {
        struct FFSWriterMarshalBase *Info = Stream->WriterMarshalData;
        if (Info->ZFPParams)
            free_attr_list(Info->ZFPParams);
        add_ref_attr_list(Attrs);
        Info->ZFPParams = Attrs;
    }
}